

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O1

void extractPackageName(char *filename,char *pkg,int32_t capacity)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  FILE *__stream;
  long lVar5;
  uint8_t *data;
  undefined8 extraout_RAX;
  char *in_RCX;
  uint *extraout_RDX;
  char *name;
  uint uVar6;
  ulong __n;
  UErrorCode UStack_464;
  char acStack_460 [1032];
  char *pcStack_58;
  size_t sStack_50;
  
  name = pkg;
  __s = findBasename(filename);
  sVar4 = strlen(__s);
  iVar2 = (int)sVar4;
  if (iVar2 < 5) {
LAB_001e75e7:
    extractPackageName();
  }
  else {
    __n = (ulong)(iVar2 - 4);
    name = ".dat";
    iVar1 = strcmp(__s + __n,".dat");
    if (iVar1 != 0) goto LAB_001e75e7;
    if (iVar2 < 0x44) {
      memcpy(pkg,__s,__n);
      pkg[__n] = '\0';
      return;
    }
  }
  extractPackageName();
  pcStack_58 = pkg;
  sStack_50 = sVar4;
  makeFullFilename(__s,name,acStack_460,(int32_t)in_RCX);
  __stream = fopen(acStack_460,"rb");
  if (__stream == (FILE *)0x0) {
    readFile();
LAB_001e7730:
    readFile();
LAB_001e773d:
    readFile();
  }
  else {
    fseek(__stream,0,2);
    lVar5 = ftell(__stream);
    fseek(__stream,0,0);
    iVar2 = ferror(__stream);
    uVar3 = (uint)lVar5;
    if (((int)uVar3 < 1) || (iVar2 != 0)) goto LAB_001e7730;
    uVar6 = uVar3 + 0xf & 0x7ffffff0;
    *extraout_RDX = uVar6;
    data = (uint8_t *)uprv_malloc_63((ulong)uVar6);
    if (data == (uint8_t *)0x0) goto LAB_001e773d;
    sVar4 = fread(data,1,(ulong)(uVar3 & 0x7fffffff),__stream);
    if (uVar3 == (uint)sVar4) {
      iVar2 = *extraout_RDX - uVar3;
      if (iVar2 != 0 && (int)uVar3 <= (int)*extraout_RDX) {
        memset(data + (uVar3 & 0x7fffffff),0xaa,(long)iVar2);
      }
      fclose(__stream);
      UStack_464 = U_ZERO_ERROR;
      uVar3 = getTypeEnumForInputData(data,*extraout_RDX,&UStack_464);
      if ((-1 < (int)uVar3) && (UStack_464 < U_ILLEGAL_ARGUMENT_ERROR)) {
        *in_RCX = "lb?e"[uVar3];
        uprv_free_63((void *)0x0);
        return;
      }
      goto LAB_001e7755;
    }
  }
  readFile();
LAB_001e7755:
  readFile();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

static void
extractPackageName(const char *filename,
                   char pkg[], int32_t capacity) {
    const char *basename;
    int32_t len;

    basename=findBasename(filename);
    len=(int32_t)strlen(basename)-4; /* -4: subtract the length of ".dat" */

    if(len<=0 || 0!=strcmp(basename+len, ".dat")) {
        fprintf(stderr, "icupkg: \"%s\" is not recognized as a package filename (must end with .dat)\n",
                         basename);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(len>=capacity) {
        fprintf(stderr, "icupkg: the package name \"%s\" is too long (>=%ld)\n",
                         basename, (long)capacity);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }

    memcpy(pkg, basename, len);
    pkg[len]=0;
}